

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O2

void Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6>
               (ParseNodePtr patternNode,anon_class_24_3_c793ac44 handler)

{
  ParseNode *pPVar1;
  code *pcVar2;
  bool bVar3;
  OpCode OVar4;
  ParseNodeBin *pPVar5;
  undefined4 *puVar6;
  ParseNodeArrLit *pPVar7;
  ParseNodeUni *pPVar8;
  ParseNodePtr *ppPVar9;
  anon_class_8_1_aca58a2a local_30;
  anon_class_8_1_aca58a2a local_28;
  ParseNodePtr local_20;
  
  OVar4 = patternNode->nop;
  if (OVar4 == knopAsg) {
    pPVar5 = ParseNode::AsParseNodeBin(patternNode);
    patternNode = pPVar5->pnode1;
    OVar4 = patternNode->nop;
  }
  if ((OVar4 & ~knopInt) != knopObjectPattern) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                       ,0x2e8,"(patternNode->IsPattern())","patternNode->IsPattern()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    OVar4 = patternNode->nop;
  }
  local_28.handler = (anon_class_32_4_34db34f2 *)&handler;
  if (OVar4 == knopArrayPattern) {
    pPVar7 = ParseNode::AsParseNodeArrLit(patternNode);
    local_30.handler = &local_28;
    ppPVar9 = &local_20;
    local_20 = (pPVar7->super_ParseNodeUni).pnode1;
    while ((ppPVar9 != (ParseNodePtr *)0x0 && (pPVar1 = *ppPVar9, pPVar1 != (ParseNode *)0x0))) {
      if (pPVar1->nop == knopList) {
        pPVar5 = ParseNode::AsParseNodeBin(pPVar1);
        anon_func::anon_class_8_1_aca58a2a::operator()(&local_30,&pPVar5->pnode1);
        pPVar5 = ParseNode::AsParseNodeBin(*ppPVar9);
        ppPVar9 = &pPVar5->pnode2;
      }
      else {
        anon_func::anon_class_8_1_aca58a2a::operator()(&local_30,ppPVar9);
        ppPVar9 = (ParseNodePtr *)0x0;
      }
    }
  }
  else {
    pPVar8 = ParseNode::AsParseNodeUni(patternNode);
    local_30.handler = &local_28;
    ppPVar9 = &local_20;
    local_20 = pPVar8->pnode1;
    while ((ppPVar9 != (ParseNodePtr *)0x0 && (pPVar1 = *ppPVar9, pPVar1 != (ParseNode *)0x0))) {
      if (pPVar1->nop == knopList) {
        pPVar5 = ParseNode::AsParseNodeBin(pPVar1);
        anon_func::anon_class_8_1_aca58a2a::operator()(&local_30,&pPVar5->pnode1);
        pPVar5 = ParseNode::AsParseNodeBin(*ppPVar9);
        ppPVar9 = &pPVar5->pnode2;
      }
      else {
        anon_func::anon_class_8_1_aca58a2a::operator()(&local_30,ppPVar9);
        ppPVar9 = (ParseNodePtr *)0x0;
      }
    }
  }
  return;
}

Assistant:

static void MapBindIdentifier(ParseNodePtr patternNode, THandler handler)
    {
        if (patternNode->nop == knopAsg)
        {
            patternNode = patternNode->AsParseNodeBin()->pnode1;
        }

        Assert(patternNode->IsPattern());
        if (patternNode->nop == knopArrayPattern)
        {
            ForEachItemInList(patternNode->AsParseNodeArrLit()->pnode1, [&](ParseNodePtr item) {
                MapBindIdentifierFromElement(item, handler);
            });
        }
        else
        {
            ForEachItemInList(patternNode->AsParseNodeUni()->pnode1, [&](ParseNodePtr item) {
                Assert(item->nop == knopObjectPatternMember || item->nop == knopEllipsis);
                if (item->nop == knopObjectPatternMember)
                {
                    MapBindIdentifierFromElement(item->AsParseNodeBin()->pnode2, handler);
                }
                else
                {
                    MapBindIdentifierFromElement(item->AsParseNodeUni()->pnode1, handler);
                }
            });
        }
    }